

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O2

void __thiscall ThreadParser::SAXHandler::startElement(SAXHandler *this)

{
  AttributeList *in_RDX;
  XMLCh *in_RSI;
  
  startElement((SAXHandler *)&this[-1].super_HandlerBase.super_ErrorHandler,in_RSI,in_RDX);
  return;
}

Assistant:

void ThreadParser::SAXHandler::startElement(const XMLCh *const name, AttributeList &attributes)
{
    SAXInstance->addToCheckSum(name);
    XMLSize_t n = attributes.getLength();
    XMLSize_t i;
    for (i=0; i<n; i++)
    {
        const XMLCh *attNam = attributes.getName(i);
        SAXInstance->addToCheckSum(attNam);
        const XMLCh *attVal = attributes.getValue(i);
        SAXInstance->addToCheckSum(attVal);
    }
}